

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
OpenMD::SelectionSet::any
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,SelectionSet *this)

{
  ulong *puVar1;
  bool bVar2;
  ulong in_RAX;
  ulong uVar3;
  long lVar4;
  int i;
  long lVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,6,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  lVar4 = 0;
  lVar5 = 0;
  do {
    bVar2 = OpenMDBitSet::none((OpenMDBitSet *)
                               ((long)&(((this->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + lVar4));
    puVar1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 1L << ((byte)lVar5 & 0x3f);
    if (bVar2) {
      uVar3 = ~uVar3 & *puVar1;
    }
    else {
      uVar3 = uVar3 | *puVar1;
    }
    *puVar1 = uVar3;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x28;
  } while (lVar5 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> SelectionSet::any() {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].any();
    return result;
  }